

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForUnion
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string union_type;
  EnumDef *enum_def;
  string struct_var;
  undefined1 local_70 [8];
  string field_method;
  string field_field;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_70,&(this->namer_).super_Namer,field);
  IdlNamer::Variable_abi_cxx11_((string *)&enum_def,&this->namer_,struct_def);
  union_type.field_2._8_8_ = (field->value).type.enum_def;
  IdlNamer::Type_abi_cxx11_((string *)local_c8,&this->namer_,(EnumDef *)union_type.field_2._8_8_);
  if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
    IdlNamer::NamespacedType_abi_cxx11_
              (&local_128,&this->namer_,(Definition *)union_type.field_2._8_8_);
    std::operator+(&local_108,&local_128,".");
    std::operator+(&local_e8,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::__cxx11::string::operator=((string *)local_c8,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  GenIndents_abi_cxx11_(&local_2c8,this,2);
  std::operator+(&local_2a8,&local_2c8,"self.");
  std::operator+(&local_288,&local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_268,&local_288," = ");
  std::operator+(&local_248,&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::operator+(&local_228,&local_248,"Creator(");
  std::operator+(&local_208,&local_228,"self.");
  std::operator+(&local_1e8,&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_1c8,&local_1e8,"Type, ");
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_def);
  std::operator+(&local_188,&local_1a8,".");
  std::operator+(&local_168,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_148,&local_168,"())");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&enum_def);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnPackForUnion(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);
    const EnumDef &enum_def = *field.value.type.enum_def;
    auto union_type = namer_.Type(enum_def);

    if (parser_.opts.include_dependence_headers) {
      union_type = namer_.NamespacedType(enum_def) + "." + union_type;
    }
    code += GenIndents(2) + "self." + field_field + " = " + union_type +
            "Creator(" + "self." + field_field + "Type, " + struct_var + "." +
            field_method + "())";
  }